

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::
RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
UnsafeArenaExtractSubrange
          (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,int start,int num,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **elements)

{
  int *piVar1;
  Rep *pRVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  
  if (num < 1) {
    return;
  }
  if (elements != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)0x0) {
    uVar5 = 0;
    do {
      elements[uVar5] =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((this->super_RepeatedPtrFieldBase).rep_)->elements[(long)start + uVar5];
      uVar5 = uVar5 + 1;
    } while ((uint)num != uVar5);
    internal::RepeatedPtrFieldBase::CloseGap(&this->super_RepeatedPtrFieldBase,start,num);
    return;
  }
  pRVar2 = (this->super_RepeatedPtrFieldBase).rep_;
  if (pRVar2 != (Rep *)0x0) {
    iVar3 = pRVar2->allocated_size;
    if (start + num < iVar3) {
      lVar4 = (long)(start + num);
      do {
        *(void **)((long)pRVar2 + (long)num * -8 + 8 + lVar4 * 8) = pRVar2->elements[lVar4];
        lVar4 = lVar4 + 1;
        pRVar2 = (this->super_RepeatedPtrFieldBase).rep_;
        iVar3 = pRVar2->allocated_size;
      } while (lVar4 < iVar3);
    }
    piVar1 = &(this->super_RepeatedPtrFieldBase).current_size_;
    *piVar1 = *piVar1 - num;
    pRVar2->allocated_size = iVar3 - num;
  }
  return;
}

Assistant:

inline void RepeatedPtrField<Element>::UnsafeArenaExtractSubrange(
    int start, int num, Element** elements) {
  GOOGLE_DCHECK_GE(start, 0);
  GOOGLE_DCHECK_GE(num, 0);
  GOOGLE_DCHECK_LE(start + num, size());

  if (num > 0) {
    // Save the values of the removed elements if requested.
    if (elements != NULL) {
      for (int i = 0; i < num; ++i) {
        elements[i] = RepeatedPtrFieldBase::Mutable<TypeHandler>(i + start);
      }
    }
    CloseGap(start, num);
  }
}